

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_db_cacheflush(sqlite3 *db)

{
  Btree *pBVar1;
  Pager *p;
  PgHdr *pPVar2;
  bool bVar3;
  PgHdr *pPg;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  if (db->nDb < 1) {
    iVar5 = 0;
  }
  else {
    bVar3 = false;
    lVar6 = 0;
    do {
      pBVar1 = db->aDb[lVar6].pBt;
      if ((pBVar1 == (Btree *)0x0) || (pBVar1->inTrans != '\x02')) {
        iVar4 = 0;
      }
      else {
        p = pBVar1->pBt->pPager;
        iVar4 = p->errCode;
        if ((p->memDb == '\0') &&
           (pPg = sqlite3PcacheDirtyList(p->pPCache), pPg != (PgHdr *)0x0 && iVar4 == 0)) {
          do {
            pPVar2 = pPg->pDirty;
            iVar4 = 0;
            if (pPg->nRef == 0) {
              iVar4 = pagerStress(p,pPg);
            }
          } while ((iVar4 == 0) && (pPg = pPVar2, pPVar2 != (PgHdr *)0x0));
        }
        if (iVar4 == 5) {
          bVar3 = true;
        }
        if (iVar4 == 5) {
          iVar4 = 0;
        }
      }
    } while ((iVar4 == 0) && (lVar6 = lVar6 + 1, lVar6 < db->nDb));
    iVar5 = 5;
    if (!bVar3) {
      iVar5 = iVar4;
    }
    if (iVar4 != 0) {
      iVar5 = iVar4;
    }
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_db_cacheflush(sqlite3 *db){
  int i;
  int rc = SQLITE_OK;
  int bSeenBusy = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt && sqlite3BtreeTxnState(pBt)==SQLITE_TXN_WRITE ){
      Pager *pPager = sqlite3BtreePager(pBt);
      rc = sqlite3PagerFlush(pPager);
      if( rc==SQLITE_BUSY ){
        bSeenBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return ((rc==SQLITE_OK && bSeenBusy) ? SQLITE_BUSY : rc);
}